

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeDOMDocumentProcessor.cpp
# Opt level: O3

DOMDocument * __thiscall
xercesc_4_0::XIncludeDOMDocumentProcessor::doXIncludeDOMProcess
          (XIncludeDOMDocumentProcessor *this,DOMDocument *source,XMLErrorReporter *errorHandler,
          XMLEntityHandler *entityResolver)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  DOMDocument *parsedDocument;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar3;
  undefined4 extraout_var_04;
  XIncludeUtils xiu;
  XIncludeUtils local_40;
  
  XIncludeUtils::XIncludeUtils(&local_40,errorHandler);
  iVar1 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xc])(source);
  parsedDocument =
       (DOMDocument *)
       (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                 ((long *)CONCAT44(extraout_var,iVar1),XMLPlatformUtils::fgMemoryManager);
  iVar1 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])(source);
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1b])
            (parsedDocument,CONCAT44(extraout_var_00,iVar1));
  uVar2 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x16])(source);
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x17])
            (parsedDocument,(ulong)(uVar2 & 0xff));
  iVar1 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x18])(source);
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x19])
            (parsedDocument,CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*(source->super_DOMNode)._vptr_DOMNode[7])(&source->super_DOMNode);
  for (plVar3 = (long *)CONCAT44(extraout_var_02,iVar1); plVar3 != (long *)0x0;
      plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3)) {
    iVar1 = (**(code **)(*plVar3 + 0x20))(plVar3);
    if (iVar1 != 10) {
      iVar1 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                        (parsedDocument,plVar3,1);
      (*(parsedDocument->super_DOMNode)._vptr_DOMNode[0x11])
                (&parsedDocument->super_DOMNode,CONCAT44(extraout_var_03,iVar1));
    }
  }
  iVar1 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(parsedDocument);
  XIncludeUtils::parseDOMNodeDoingXInclude
            (&local_40,(DOMNode *)CONCAT44(extraout_var_04,iVar1),parsedDocument,entityResolver);
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x20])(parsedDocument);
  XIncludeUtils::~XIncludeUtils(&local_40);
  return parsedDocument;
}

Assistant:

DOMDocument *
XIncludeDOMDocumentProcessor::doXIncludeDOMProcess(const DOMDocument * const source, XMLErrorReporter *errorHandler, XMLEntityHandler* entityResolver /*=NULL*/){
    XIncludeUtils xiu(errorHandler);

    DOMImplementation* impl = source->getImplementation();
    DOMDocument *xincludedDocument = impl->createDocument();
    
    try
    {
        /* set up the declaration etc of the output document to match the source */
        xincludedDocument->setDocumentURI( source->getDocumentURI());
        xincludedDocument->setXmlStandalone( source->getXmlStandalone());
        xincludedDocument->setXmlVersion( source->getXmlVersion());

        /* copy entire source document into the xincluded document. Xincluded document can
           then be modified in place */
        DOMNode *child = source->getFirstChild();
        for (; child != NULL; child = child->getNextSibling()){
            if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE){
                /* I am simply ignoring these at the moment */
                continue;
            }
            DOMNode *newNode = xincludedDocument->importNode(child, true);
            xincludedDocument->appendChild(newNode);
        }

        DOMNode *docNode = xincludedDocument->getDocumentElement();
        /* parse and include the document node */
        xiu.parseDOMNodeDoingXInclude(docNode, xincludedDocument, entityResolver);

        xincludedDocument->normalizeDocument();
    }
    catch(const XMLErrs::Codes)
    {
        xincludedDocument->release();
        return NULL;
    }
    catch(...)
    {
        xincludedDocument->release();
        throw;
    }

    return xincludedDocument;
}